

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager<boost::_bi::bind_t<void,_void_(*)(int_&,_int),_boost::_bi::list2<boost::arg<1>,_boost::_bi::value<int>_>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  undefined8 uVar1;
  bool bVar2;
  pointer_____offset_0x10___ *ppuStack_18;
  
  if (op == get_functor_type_tag) {
    *(pointer_____offset_0x10___ **)out_buffer =
         &_bi::
          bind_t<void,void(*)(int&,int),boost::_bi::list2<boost::arg<1>,boost::_bi::value<int>>>::
          typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
    return;
  }
  if (op < destroy_functor_tag) {
    uVar1 = *(undefined8 *)(in_buffer->data + 8);
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)(out_buffer->data + 8) = uVar1;
  }
  else if (op != destroy_functor_tag) {
    if (op == check_functor_type_tag) {
      ppuStack_18 = &_bi::
                     bind_t<void,void(*)(int&,int),boost::_bi::list2<boost::arg<1>,boost::_bi::value<int>>>
                     ::typeinfo;
      bVar2 = typeindex::operator==
                        (*(type_info **)out_buffer,
                         (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                         &ppuStack_18);
      if (bVar2) {
        *(function_buffer **)out_buffer = in_buffer;
      }
      else {
        *(undefined8 *)out_buffer = 0;
      }
    }
    else {
      *(pointer_____offset_0x10___ **)out_buffer =
           &_bi::
            bind_t<void,void(*)(int&,int),boost::_bi::list2<boost::arg<1>,boost::_bi::value<int>>>::
            typeinfo;
      *(char *)((long)out_buffer + 8) = '\0';
      *(char *)((long)out_buffer + 9) = '\0';
    }
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          if (op == get_functor_type_tag) {
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
          } else {
            manager(in_buffer, out_buffer, op, tag_type());
          }
        }